

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O2

void sync_c0_tcstatus(CPUMIPSState_conflict5 *cpu,int tc,target_ulong v)

{
  cpu->CP0_Status =
       cpu->CP0_Status & 0xeffffe7U |
       (uint)tc >> 8 & 0x18 | (uint)tc >> 3 & 0x1000000 | tc & 0xf0000000U;
  cpu->CP0_EntryHi =
       (ulong)((uint)cpu->CP0_EntryHi_ASID_mask & tc) |
       ~cpu->CP0_EntryHi_ASID_mask & cpu->CP0_EntryHi;
  compute_hflags(cpu);
  return;
}

Assistant:

static void sync_c0_tcstatus(CPUMIPSState *cpu, int tc,
                             target_ulong v)
{
    uint32_t status;
    uint32_t tcu, tmx, tasid, tksu;
    uint32_t mask = ((1U << CP0St_CU3)
                       | (1 << CP0St_CU2)
                       | (1 << CP0St_CU1)
                       | (1 << CP0St_CU0)
                       | (1 << CP0St_MX)
                       | (3 << CP0St_KSU));

    tcu = (v >> CP0TCSt_TCU0) & 0xf;
    tmx = (v >> CP0TCSt_TMX) & 0x1;
    tasid = v & cpu->CP0_EntryHi_ASID_mask;
    tksu = (v >> CP0TCSt_TKSU) & 0x3;

    status = tcu << CP0St_CU0;
    status |= tmx << CP0St_MX;
    status |= tksu << CP0St_KSU;

    cpu->CP0_Status &= ~mask;
    cpu->CP0_Status |= status;

    /* Sync the TASID with EntryHi.  */
    cpu->CP0_EntryHi &= ~cpu->CP0_EntryHi_ASID_mask;
    cpu->CP0_EntryHi |= tasid;

    compute_hflags(cpu);
}